

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
PhyloTree::getIntEdgeAttribNorms(PhyloTree *this)

{
  bool bVar1;
  reference this_00;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  PhyloTreeEdge *e;
  iterator __end1;
  iterator __begin1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1;
  vector<double,_std::allocator<double>_> *norms;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_ffffffffffffff88;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  size_type in_stack_ffffffffffffffb8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_38;
  long local_30;
  undefined1 local_11;
  
  local_11 = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x16d9ef);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size
            ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)(in_RSI + 0x20));
  std::vector<double,_std::allocator<double>_>::reserve
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_30 = in_RSI + 0x20;
  local_38._M_current =
       (PhyloTreeEdge *)
       std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin(in_stack_ffffffffffffff88);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end(in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                             *)in_stack_ffffffffffffff90,
                            (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                             *)in_stack_ffffffffffffff88), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
              ::operator*(&local_38);
    in_stack_ffffffffffffff90 =
         (vector<double,_std::allocator<double>_> *)PhyloTreeEdge::getLength(this_00);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff90,(value_type_conflict *)in_stack_ffffffffffffff88);
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator++(&local_38);
  }
  return in_RDI;
}

Assistant:

vector<double> PhyloTree::getIntEdgeAttribNorms() {
    vector<double> norms;
    norms.reserve(edges.size());
    for (auto &e : edges) {
        norms.push_back(e.getLength());
    }
    return norms;
}